

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cg.c
# Opt level: O2

int evaluate_constant_expr(dill_stream s,sm_ref expr,long *value)

{
  sm_ref psVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  bool bVar6;
  ulong local_28;
  byte local_20;
  undefined7 uStack_1f;
  
  do {
    lVar4 = 0x20;
    switch(expr->node_type) {
    case cod_assignment_expression:
    case cod_field_ref:
    case cod_subroutine_call:
    case cod_element_ref:
      __assert_fail("FALSE",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/ffs/ffs/cod/cg.c"
                    ,0x296,"int evaluate_constant_expr(dill_stream, sm_ref, long *)");
    case cod_comma_expression:
    case cod_conditional_operator:
    case cod_type_specifier:
    case cod_struct_type_decl:
    case cod_enum_type_decl:
    case cod_array_type_decl:
    case cod_reference_type_decl:
    case cod_field:
switchD_0012891f_caseD_a:
      __assert_fail("FALSE",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/ffs/ffs/cod/cg.c"
                    ,0x298,"int evaluate_constant_expr(dill_stream, sm_ref, long *)");
    case cod_operator:
      psVar1 = (expr->node).enumerator.const_expression;
      if ((psVar1 != (sm_ref)0x0) &&
         (iVar2 = evaluate_constant_expr(s,psVar1,(long *)&local_28), iVar2 == 0)) {
        return 0;
      }
      iVar2 = (expr->node).jump_statement.continue_flag;
      psVar1 = (expr->node).declaration.freeable_complex_type;
      if (iVar2 == 0x17) {
        iVar2 = cg_get_size(s,psVar1);
        local_28 = (ulong)iVar2;
        goto LAB_00128a0c;
      }
      if (psVar1 != (sm_ref)0x0) {
        iVar2 = evaluate_constant_expr(s,psVar1,(long *)&local_20);
        if (iVar2 == 0) {
          return 0;
        }
        iVar2 = (expr->node).jump_statement.continue_flag;
      }
      switch(iVar2) {
      case 0:
        local_28 = (long)local_28 % CONCAT71(uStack_1f,local_20);
        break;
      case 1:
        local_28 = CONCAT71(uStack_1f,local_20) + local_28;
        break;
      case 2:
        local_28 = local_28 - CONCAT71(uStack_1f,local_20);
        break;
      case 3:
        local_28 = (ulong)((long)local_28 <= CONCAT71(uStack_1f,local_20));
        break;
      case 4:
        local_28 = (ulong)((long)local_28 < CONCAT71(uStack_1f,local_20));
        break;
      case 5:
        local_28 = (ulong)(CONCAT71(uStack_1f,local_20) <= (long)local_28);
        break;
      case 6:
        local_28 = (ulong)(CONCAT71(uStack_1f,local_20) < (long)local_28);
        break;
      case 7:
        local_28 = CONCAT71(uStack_1f,local_20);
        break;
      case 8:
        bVar6 = local_28 == CONCAT71(uStack_1f,local_20);
        goto LAB_00128b2f;
      case 9:
        local_28 = (ulong)(CONCAT71(uStack_1f,local_20) == 0);
        break;
      case 10:
        bVar6 = CONCAT71(uStack_1f,local_20) == 0 && local_28 == 0;
LAB_00128b2f:
        local_28 = (ulong)!bVar6;
        break;
      case 0xb:
        local_28 = (ulong)(CONCAT71(uStack_1f,local_20) != 0 && local_28 != 0);
        break;
      case 0xc:
        local_28 = CONCAT71(uStack_1f,local_20) & local_28;
        break;
      case 0xd:
        local_28 = CONCAT71(uStack_1f,local_20) | local_28;
        break;
      case 0xe:
        local_28 = CONCAT71(uStack_1f,local_20) ^ local_28;
        break;
      case 0xf:
        local_28 = local_28 << (local_20 & 0x3f);
        break;
      case 0x10:
        local_28 = (long)local_28 >> (local_20 & 0x3f);
        break;
      case 0x11:
        local_28 = CONCAT71(uStack_1f,local_20) * local_28;
        break;
      case 0x12:
        local_28 = (long)local_28 / CONCAT71(uStack_1f,local_20);
        break;
      case 0x13:
      case 0x14:
      case 0x15:
      case 0x16:
      case 0x17:
        __assert_fail("FALSE",
                      "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/ffs/ffs/cod/cg.c"
                      ,0x28c,"int evaluate_constant_expr(dill_stream, sm_ref, long *)");
      case 0x18:
        local_28 = ~CONCAT71(uStack_1f,local_20);
        break;
      default:
        goto LAB_00128a12;
      }
LAB_00128a0c:
      *value = local_28;
LAB_00128a12:
      return 1;
    case cod_identifier:
      lVar4 = 0x18;
      break;
    case cod_constant:
      pcVar5 = (expr->node).jump_statement.goto_target;
      if (*pcVar5 == '0') {
        if (pcVar5[1] == 'x') {
          pcVar5 = pcVar5 + 2;
          pcVar3 = "%lx";
        }
        else {
          pcVar3 = "%lo";
        }
      }
      else {
        pcVar3 = "%ld";
      }
      iVar2 = __isoc99_sscanf(pcVar5,pcVar3,&local_28);
      if (iVar2 != 1) {
        puts("sscanf failed");
      }
      goto LAB_00128a0c;
    case cod_cast:
      break;
    default:
      if (expr->node_type != cod_declaration) goto switchD_0012891f_caseD_a;
      lVar4 = 0x38;
      if ((expr->node).declaration.const_var == 0) {
        return 0;
      }
    }
    expr = *(sm_ref *)((long)&expr->node_type + lVar4);
  } while( true );
}

Assistant:

static int
evaluate_constant_expr(dill_stream s, sm_ref expr, long*value)
{
    switch(expr->node_type) {
    case cod_constant: {
	char *val = expr->node.constant.const_val;
	long l;
	if (val[0] == '0') {
	    /* hex or octal */
	    if (val[1] == 'x') {
		/* hex */
		if (sscanf(val+2, "%lx", &l) != 1) 
		    printf("sscanf failed\n");
	    } else {
		if (sscanf(val, "%lo", &l) != 1) 
		    printf("sscanf failed\n");
	    }
	} else {
	    if (sscanf(val, "%ld", &l) != 1)
		printf("sscanf failed\n");
	}
	*value = l;
	return 1;
    }
    case cod_identifier:
	return evaluate_constant_expr(s, expr->node.identifier.sm_declaration, value);
    case cod_declaration:
	if (!expr->node.declaration.const_var) return 0;
	return evaluate_constant_expr(s, expr->node.declaration.init_value, value);
    case cod_operator: {
	long left, right;
	if (expr->node.operator.left != NULL) {
	    if (!evaluate_constant_expr(s, expr->node.operator.left, &left)) return 0;
	}
	if (expr->node.operator.op == op_sizeof) {
	    *value = cg_get_size(s, expr->node.operator.right);
	    return 1;
	}
	if (expr->node.operator.right != NULL) {
	    if (!evaluate_constant_expr(s, expr->node.operator.right, &right)) return 0;
	}
	switch(expr->node.operator.op) {
	case  op_modulus:
	    *value = left % right;
	    break;
	case  op_plus:
	    *value = left + right;
	    break;
	case  op_minus:
	    *value = left - right;
	    break;
	case  op_leq:
	    *value = left <= right;
	    break;
	case  op_lt:
	    *value = left < right;
	    break;
	case  op_geq:
	    *value = left >= right;
	    break;
	case  op_gt:
	    *value = left > right;
	    break;
	case  op_eq:
	    *value = left = right;
	    break;
	case  op_neq:
	    *value = left != right;
	    break;
	case  op_log_or:
	    *value = left || right;
	    break;
	case  op_arith_or:
	    *value = left | right;
	    break;
	case  op_arith_xor:
	    *value = left ^ right;
	    break;
	case  op_log_and:
	    *value = left && right;
	    break;
	case  op_arith_and:
	    *value = left & right;
	    break;
	case  op_mult:
	    *value = left * right;
	    break;
	case  op_div:
	    *value = left / right;
	    break;
	case op_log_neg:
	    *value = !right;
	    break;
	case op_not:
	    *value = ~right;
	    break;
	case op_left_shift:
	    *value = left << right;
	    break;
	case op_right_shift:
	    *value = left >> right;
	    break;
	case  op_deref:
	case  op_address:
	case op_inc:
	case op_dec:
	case op_sizeof:
	    assert(FALSE);
	}
	return 1;
    }
    case cod_cast:
	return evaluate_constant_expr(s, expr->node.cast.expression, value);
    case cod_assignment_expression:
    case cod_field_ref:
    case cod_element_ref:
    case cod_subroutine_call:
	assert(FALSE);
    default:
	assert(FALSE);
    }
    return 0;
}